

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_template.hpp
# Opt level: O3

result_type * __thiscall
boost::function1<boost::test_tools::assertion_result,_unsigned_long>::operator()
          (result_type *__return_storage_ptr__,
          function1<boost::test_tools::assertion_result,_unsigned_long> *this,unsigned_long a0)

{
  vtable_base *pvVar1;
  bad_function_call local_18;
  
  pvVar1 = (this->super_function_base).vtable;
  if (pvVar1 != (vtable_base *)0x0) {
    (**(code **)(((ulong)pvVar1 & 0xfffffffffffffffe) + 8))
              (__return_storage_ptr__,&(this->super_function_base).functor);
    return __return_storage_ptr__;
  }
  std::runtime_error::runtime_error(&local_18.super_runtime_error,"call to empty boost::function");
  local_18._0_8_ = &PTR__runtime_error_001cb140;
  throw_exception<boost::bad_function_call>(&local_18);
}

Assistant:

bool
        assign_to(FunctionObj f, function_buffer& functor, function_obj_tag) const
        {
          if (!boost::detail::function::has_empty_target(boost::addressof(f))) {
            assign_functor(f, functor,
                           mpl::bool_<(function_allows_small_object_optimization<FunctionObj>::value)>());
            return true;
          } else {
            return false;
          }
        }